

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O2

IParamTestSuiteInfo * __thiscall
iutest::detail::ParamTestSuiteHolder::FindTestSuitePatternHolder<std::__cxx11::string>
          (ParamTestSuiteHolder *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *testsuite,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *package)

{
  pointer ppIVar1;
  bool bVar2;
  pointer ppIVar3;
  
  ppIVar3 = (this->m_testsuite_infos).
            super__Vector_base<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (this->m_testsuite_infos).
            super__Vector_base<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppIVar3 == ppIVar1) {
      return (IParamTestSuiteInfo *)0x0;
    }
    bVar2 = IParamTestSuiteInfo::is_same(*ppIVar3,testsuite,package);
    if (bVar2) break;
    ppIVar3 = ppIVar3 + 1;
  }
  return *ppIVar3;
}

Assistant:

IParamTestSuiteInfo* FindTestSuitePatternHolder(const T& testsuite, const T& package)
    {
        for( TestSuiteInfoContainer::iterator it=m_testsuite_infos.begin(), end=m_testsuite_infos.end(); it != end; ++it )
        {
            if( (*it)->is_same(testsuite, package) )
            {
                return (*it);
            }
        }
        return NULL;
    }